

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__decode_and_resample_downsample(stbir__info *stbir_info,int n)

{
  int iVar1;
  int n_local;
  stbir__info *stbir_info_local;
  
  stbir__decode_scanline(stbir_info,n);
  memset(stbir_info->horizontal_buffer,0,(long)(stbir_info->output_w * stbir_info->channels) << 2);
  iVar1 = stbir__use_width_upsampling(stbir_info);
  if (iVar1 == 0) {
    stbir__resample_horizontal_downsample(stbir_info,stbir_info->horizontal_buffer);
  }
  else {
    stbir__resample_horizontal_upsample(stbir_info,stbir_info->horizontal_buffer);
  }
  return;
}

Assistant:

static void stbir__decode_and_resample_downsample(stbir__info* stbir_info, int n)
{
    // Decode the nth scanline from the source image into the decode buffer.
    stbir__decode_scanline(stbir_info, n);

    memset(stbir_info->horizontal_buffer, 0, stbir_info->output_w * stbir_info->channels * sizeof(float));

    // Now resample it into the horizontal buffer.
    if (stbir__use_width_upsampling(stbir_info))
        stbir__resample_horizontal_upsample(stbir_info, stbir_info->horizontal_buffer);
    else
        stbir__resample_horizontal_downsample(stbir_info, stbir_info->horizontal_buffer);

    // Now it's sitting in the horizontal buffer ready to be distributed into the ring buffers.
}